

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::TanH_x86_avx::forward_inplace(TanH_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 (*pauVar7) [16];
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  float *pfVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar53;
  float fVar55;
  float fVar56;
  undefined1 auVar54 [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 in_ZMM15 [64];
  
  uVar8 = bottom_top_blob->c;
  uVar10 = (ulong)uVar8;
  uVar9 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar8) {
      auVar35 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                   CONCAT424(0x42b0c0a5,
                                             CONCAT420(0x42b0c0a5,
                                                       CONCAT416(0x42b0c0a5,
                                                                 CONCAT412(0x42b0c0a5,
                                                                           CONCAT48(0x42b0c0a5,
                                                                                                                                                                        
                                                  0x42b0c0a542b0c0a5)))))));
      auVar40 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                   CONCAT424(0xc2b0c0a5,
                                             CONCAT420(0xc2b0c0a5,
                                                       CONCAT416(0xc2b0c0a5,
                                                                 CONCAT412(0xc2b0c0a5,
                                                                           CONCAT48(0xc2b0c0a5,
                                                                                                                                                                        
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar46._8_4_ = 0x3f800000;
      auVar46._0_8_ = 0x3f8000003f800000;
      auVar46._12_4_ = 0x3f800000;
      auVar46._16_4_ = 0x3f800000;
      auVar46._20_4_ = 0x3f800000;
      auVar46._24_4_ = 0x3f800000;
      auVar46._28_4_ = 0x3f800000;
      uVar5 = 0;
      auVar15._8_4_ = 0x3f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._12_4_ = 0x3f800000;
      auVar52._8_4_ = 0x40000000;
      auVar52._0_8_ = 0x4000000040000000;
      auVar52._12_4_ = 0x40000000;
      auVar52._16_4_ = 0x40000000;
      auVar52._20_4_ = 0x40000000;
      auVar52._24_4_ = 0x40000000;
      auVar52._28_4_ = 0x40000000;
      do {
        if (0 < (int)uVar9) {
          pfVar11 = (float *)(bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          uVar8 = uVar9;
          do {
            auVar43._0_4_ = *pfVar11 * -2.0;
            auVar43._4_4_ = pfVar11[1] * -2.0;
            auVar43._8_4_ = pfVar11[2] * -2.0;
            auVar43._12_4_ = pfVar11[3] * -2.0;
            auVar43._16_4_ = pfVar11[4] * -2.0;
            auVar43._20_4_ = pfVar11[5] * -2.0;
            auVar43._28_36_ = in_ZMM15._28_36_;
            auVar43._24_4_ = pfVar11[6] * -2.0;
            auVar22 = vminps_avx(auVar43._0_32_,auVar35._0_32_);
            auVar1 = vmaxps_avx(auVar22,auVar40._0_32_);
            auVar22._0_4_ = auVar1._0_4_ * 1.442695 + 0.5;
            auVar22._4_4_ = auVar1._4_4_ * 1.442695 + 0.5;
            auVar22._8_4_ = auVar1._8_4_ * 1.442695 + 0.5;
            auVar22._12_4_ = auVar1._12_4_ * 1.442695 + 0.5;
            auVar22._16_4_ = auVar1._16_4_ * 1.442695 + 0.5;
            auVar22._20_4_ = auVar1._20_4_ * 1.442695 + 0.5;
            auVar22._24_4_ = auVar1._24_4_ * 1.442695 + 0.5;
            auVar22._28_4_ = 0xbfc00000;
            auVar23 = vroundps_avx(auVar22,1);
            auVar22 = vcmpps_avx(auVar22,auVar23,1);
            auVar22 = vandps_avx(auVar22,auVar46);
            auVar22 = vsubps_avx(auVar23,auVar22);
            fVar53 = auVar1._0_4_ + auVar22._0_4_ * -0.6931472;
            fVar55 = auVar1._4_4_ + auVar22._4_4_ * -0.6931472;
            fVar56 = auVar1._8_4_ + auVar22._8_4_ * -0.6931472;
            fVar57 = auVar1._12_4_ + auVar22._12_4_ * -0.6931472;
            fVar26 = auVar1._16_4_ + auVar22._16_4_ * -0.6931472;
            fVar27 = auVar1._20_4_ + auVar22._20_4_ * -0.6931472;
            fVar28 = auVar1._24_4_ + auVar22._24_4_ * -0.6931472;
            in_ZMM15 = ZEXT3264(CONCAT428(auVar1._28_4_,
                                          CONCAT424(fVar28 * fVar28,
                                                    CONCAT420(fVar27 * fVar27,
                                                              CONCAT416(fVar26 * fVar26,
                                                                        CONCAT412(fVar57 * fVar57,
                                                                                  CONCAT48(fVar56 * 
                                                  fVar56,CONCAT44(fVar55 * fVar55,fVar53 * fVar53)))
                                                  )))));
            auVar37._0_4_ = (int)auVar22._0_4_;
            auVar37._4_4_ = (int)auVar22._4_4_;
            auVar37._8_4_ = (int)auVar22._8_4_;
            auVar37._12_4_ = (int)auVar22._12_4_;
            auVar23._16_4_ = (int)auVar22._16_4_;
            auVar23._0_16_ = auVar37;
            auVar23._20_4_ = (int)auVar22._20_4_;
            auVar23._24_4_ = (int)auVar22._24_4_;
            auVar23._28_4_ = (int)auVar22._28_4_;
            auVar36 = vpslld_avx(auVar37,0x17);
            auVar37 = vpslld_avx(auVar23._16_16_,0x17);
            auVar37 = vpaddd_avx(auVar37,auVar15);
            auVar36 = vpaddd_avx(auVar36,auVar15);
            auVar24._0_4_ =
                 (fVar53 + 1.0 +
                 fVar53 * fVar53 *
                 (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
                   0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5)) * auVar36._0_4_ + 1.0;
            auVar24._4_4_ =
                 (fVar55 + 1.0 +
                 fVar55 * fVar55 *
                 (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                   0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5)) * auVar36._4_4_ + 1.0;
            auVar24._8_4_ =
                 (fVar56 + 1.0 +
                 fVar56 * fVar56 *
                 (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                   0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5)) * auVar36._8_4_ + 1.0;
            auVar24._12_4_ =
                 (fVar57 + 1.0 +
                 fVar57 * fVar57 *
                 (((((fVar57 * 0.00019875691 + 0.0013981999) * fVar57 + 0.008333452) * fVar57 +
                   0.041665796) * fVar57 + 0.16666666) * fVar57 + 0.5)) * auVar36._12_4_ + 1.0;
            auVar24._16_4_ =
                 (fVar26 + 1.0 +
                 fVar26 * fVar26 *
                 (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                   0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar37._0_4_ + 1.0;
            auVar24._20_4_ =
                 (fVar27 + 1.0 +
                 fVar27 * fVar27 *
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar37._4_4_ + 1.0;
            auVar24._24_4_ =
                 (fVar28 + 1.0 +
                 fVar28 * fVar28 *
                 (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
                   0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar37._8_4_ + 1.0;
            auVar24._28_4_ = auVar37._12_4_ + 1.0;
            auVar22 = vrcpps_avx(auVar24);
            fVar53 = auVar22._0_4_;
            fVar55 = auVar22._4_4_;
            fVar56 = auVar22._8_4_;
            fVar57 = auVar22._12_4_;
            fVar26 = auVar22._16_4_;
            fVar27 = auVar22._20_4_;
            fVar28 = auVar22._24_4_;
            auVar1._4_4_ = auVar24._4_4_ * (fVar55 + fVar55);
            auVar1._0_4_ = auVar24._0_4_ * (fVar53 + fVar53);
            auVar1._8_4_ = auVar24._8_4_ * (fVar56 + fVar56);
            auVar1._12_4_ = auVar24._12_4_ * (fVar57 + fVar57);
            auVar1._16_4_ = auVar24._16_4_ * (fVar26 + fVar26);
            auVar1._20_4_ = auVar24._20_4_ * (fVar27 + fVar27);
            auVar1._24_4_ = auVar24._24_4_ * (fVar28 + fVar28);
            auVar1._28_4_ = auVar24._28_4_;
            auVar1 = vsubps_avx(auVar52,auVar1);
            auVar40 = ZEXT3264(auVar40._0_32_);
            auVar35 = ZEXT3264(auVar35._0_32_);
            *pfVar11 = fVar53 + fVar53 + -1.0 + fVar53 * auVar1._0_4_;
            pfVar11[1] = fVar55 + fVar55 + -1.0 + fVar55 * auVar1._4_4_;
            pfVar11[2] = fVar56 + fVar56 + -1.0 + fVar56 * auVar1._8_4_;
            pfVar11[3] = fVar57 + fVar57 + -1.0 + fVar57 * auVar1._12_4_;
            pfVar11[4] = fVar26 + fVar26 + -1.0 + fVar26 * auVar1._16_4_;
            pfVar11[5] = fVar27 + fVar27 + -1.0 + fVar27 * auVar1._20_4_;
            pfVar11[6] = fVar28 + fVar28 + -1.0 + fVar28 * auVar1._24_4_;
            pfVar11[7] = auVar22._28_4_ + auVar22._28_4_ + -1.0 + auVar1._28_4_;
            pfVar11 = pfVar11 + 8;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar10);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar8) {
      uVar5 = 0;
      auVar35 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
      auVar40 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar43 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar47 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar50._8_4_ = 0x40000000;
      auVar50._0_8_ = 0x4000000040000000;
      auVar50._12_4_ = 0x40000000;
      do {
        if (0 < (int)uVar9) {
          pauVar7 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          auVar48 = auVar47;
          uVar8 = uVar9;
          do {
            auVar54._0_4_ = *(float *)*pauVar7 * -2.0;
            auVar54._4_4_ = *(float *)((long)*pauVar7 + 4) * -2.0;
            auVar54._8_4_ = *(float *)((long)*pauVar7 + 8) * -2.0;
            auVar54._12_4_ = *(float *)((long)*pauVar7 + 0xc) * -2.0;
            auVar15 = vminps_avx(auVar54,auVar35._0_16_);
            auVar36 = vmaxps_avx(auVar15,auVar40._0_16_);
            auVar58._0_4_ = auVar36._0_4_ * auVar43._0_4_ + 0.5;
            auVar58._4_4_ = auVar36._4_4_ * auVar43._4_4_ + 0.5;
            auVar58._8_4_ = auVar36._8_4_ * auVar43._8_4_ + 0.5;
            auVar58._12_4_ = auVar36._12_4_ * auVar43._12_4_ + 0.5;
            auVar13._0_4_ = (int)auVar58._0_4_;
            auVar13._4_4_ = (int)auVar58._4_4_;
            auVar13._8_4_ = (int)auVar58._8_4_;
            auVar13._12_4_ = (int)auVar58._12_4_;
            auVar37 = vcvtdq2ps_avx(auVar13);
            auVar15 = vcmpps_avx(auVar58,auVar37,1);
            auVar41 = auVar48._0_16_;
            auVar15 = vandps_avx(auVar15,auVar41);
            auVar15 = vsubps_avx(auVar37,auVar15);
            fVar53 = auVar36._0_4_ + auVar15._0_4_ * -0.6931472;
            fVar55 = auVar36._4_4_ + auVar15._4_4_ * -0.6931472;
            fVar56 = auVar36._8_4_ + auVar15._8_4_ * -0.6931472;
            fVar57 = auVar36._12_4_ + auVar15._12_4_ * -0.6931472;
            auVar47 = ZEXT1664(auVar41);
            auVar14._0_4_ = (int)auVar15._0_4_;
            auVar14._4_4_ = (int)auVar15._4_4_;
            auVar14._8_4_ = (int)auVar15._8_4_;
            auVar14._12_4_ = (int)auVar15._12_4_;
            auVar15 = vpslld_avx(auVar14,0x17);
            auVar15 = vpaddd_avx(auVar15,auVar41);
            auVar16._0_4_ =
                 (fVar53 + auVar48._0_4_ +
                 fVar53 * fVar53 *
                 (fVar53 * (fVar53 * (fVar53 * (fVar53 * (fVar53 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar15._0_4_ + auVar48._0_4_;
            auVar16._4_4_ =
                 (fVar55 + auVar48._4_4_ +
                 fVar55 * fVar55 *
                 (fVar55 * (fVar55 * (fVar55 * (fVar55 * (fVar55 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar15._4_4_ + auVar48._4_4_;
            auVar16._8_4_ =
                 (fVar56 + auVar48._8_4_ +
                 fVar56 * fVar56 *
                 (fVar56 * (fVar56 * (fVar56 * (fVar56 * (fVar56 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar15._8_4_ + auVar48._8_4_;
            auVar16._12_4_ =
                 (fVar57 + auVar48._12_4_ +
                 fVar57 * fVar57 *
                 (fVar57 * (fVar57 * (fVar57 * (fVar57 * (fVar57 * 0.00019875691 + 0.0013981999) +
                                               0.008333452) + 0.041665796) + 0.16666666) + 0.5)) *
                 auVar15._12_4_ + auVar48._12_4_;
            auVar15 = vrcpps_avx(auVar16);
            fVar53 = auVar15._0_4_;
            fVar55 = auVar15._4_4_;
            fVar56 = auVar15._8_4_;
            fVar57 = auVar15._12_4_;
            auVar17._0_4_ = (fVar53 + fVar53) * auVar16._0_4_;
            auVar17._4_4_ = (fVar55 + fVar55) * auVar16._4_4_;
            auVar17._8_4_ = (fVar56 + fVar56) * auVar16._8_4_;
            auVar17._12_4_ = (fVar57 + fVar57) * auVar16._12_4_;
            auVar15 = vsubps_avx(auVar50,auVar17);
            auVar18._0_4_ = fVar53 + fVar53 + -1.0 + fVar53 * auVar15._0_4_;
            auVar18._4_4_ = fVar55 + fVar55 + -1.0 + fVar55 * auVar15._4_4_;
            auVar18._8_4_ = fVar56 + fVar56 + -1.0 + fVar56 * auVar15._8_4_;
            auVar18._12_4_ = fVar57 + fVar57 + -1.0 + fVar57 * auVar15._12_4_;
            auVar35 = ZEXT1664(auVar35._0_16_);
            auVar43 = ZEXT1664(auVar43._0_16_);
            *pauVar7 = auVar18;
            auVar40 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
            pauVar7 = pauVar7 + 1;
            uVar8 = uVar8 - 1;
            auVar48 = auVar47;
          } while (uVar8 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar10);
    }
  }
  else if (0 < (int)uVar8) {
    uVar5 = 0;
    do {
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar39._8_4_ = 0xc2b0c0a5;
      auVar39._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar32._8_4_ = 0x42b0c0a5;
      auVar32._0_8_ = 0x42b0c0a542b0c0a5;
      auVar51._12_4_ = 0x3f800000;
      auVar39._12_4_ = 0xc2b0c0a5;
      auVar32._12_4_ = 0x42b0c0a5;
      auVar51._16_4_ = 0x3f800000;
      auVar39._16_4_ = 0xc2b0c0a5;
      auVar32._16_4_ = 0x42b0c0a5;
      auVar51._20_4_ = 0x3f800000;
      auVar39._20_4_ = 0xc2b0c0a5;
      auVar32._20_4_ = 0x42b0c0a5;
      auVar51._24_4_ = 0x3f800000;
      auVar39._24_4_ = 0xc2b0c0a5;
      auVar32._24_4_ = 0x42b0c0a5;
      auVar51._28_4_ = 0x3f800000;
      auVar39._28_4_ = 0xc2b0c0a5;
      auVar32._28_4_ = 0x42b0c0a5;
      pfVar11 = (float *)(bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      if ((int)uVar9 < 8) {
        uVar8 = 0;
      }
      else {
        iVar4 = 7;
        do {
          auVar3._4_4_ = pfVar11[1] * -2.0;
          auVar3._0_4_ = *pfVar11 * -2.0;
          auVar3._8_4_ = pfVar11[2] * -2.0;
          auVar3._12_4_ = pfVar11[3] * -2.0;
          auVar3._16_4_ = pfVar11[4] * -2.0;
          auVar3._20_4_ = pfVar11[5] * -2.0;
          auVar3._24_4_ = pfVar11[6] * -2.0;
          auVar3._28_4_ = 0xc0000000;
          auVar46 = vminps_avx(auVar3,auVar32);
          auVar52 = vmaxps_avx(auVar46,auVar39);
          auVar33._0_4_ = auVar52._0_4_ * 1.442695 + 0.5;
          auVar33._4_4_ = auVar52._4_4_ * 1.442695 + 0.5;
          auVar33._8_4_ = auVar52._8_4_ * 1.442695 + 0.5;
          auVar33._12_4_ = auVar52._12_4_ * 1.442695 + 0.5;
          auVar33._16_4_ = auVar52._16_4_ * 1.442695 + 0.5;
          auVar33._20_4_ = auVar52._20_4_ * 1.442695 + 0.5;
          auVar33._24_4_ = auVar52._24_4_ * 1.442695 + 0.5;
          auVar33._28_4_ = 0x42b1c0a5;
          auVar22 = vroundps_avx(auVar33,1);
          auVar46 = vcmpps_avx(auVar33,auVar22,1);
          auVar46 = vandps_avx(auVar51,auVar46);
          auVar46 = vsubps_avx(auVar22,auVar46);
          fVar53 = auVar52._0_4_ + auVar46._0_4_ * -0.6931472;
          fVar55 = auVar52._4_4_ + auVar46._4_4_ * -0.6931472;
          fVar56 = auVar52._8_4_ + auVar46._8_4_ * -0.6931472;
          fVar57 = auVar52._12_4_ + auVar46._12_4_ * -0.6931472;
          fVar26 = auVar52._16_4_ + auVar46._16_4_ * -0.6931472;
          fVar27 = auVar52._20_4_ + auVar46._20_4_ * -0.6931472;
          fVar28 = auVar52._24_4_ + auVar46._24_4_ * -0.6931472;
          auVar36._0_4_ = (int)auVar46._0_4_;
          auVar36._4_4_ = (int)auVar46._4_4_;
          auVar36._8_4_ = (int)auVar46._8_4_;
          auVar36._12_4_ = (int)auVar46._12_4_;
          auVar34._16_4_ = (int)auVar46._16_4_;
          auVar34._0_16_ = auVar36;
          auVar34._20_4_ = (int)auVar46._20_4_;
          auVar34._24_4_ = (int)auVar46._24_4_;
          auVar34._28_4_ = (int)auVar46._28_4_;
          auVar37 = vpslld_avx(auVar36,0x17);
          auVar15 = vpslld_avx(auVar34._16_16_,0x17);
          auVar41._8_4_ = 0x3f800000;
          auVar41._0_8_ = 0x3f8000003f800000;
          auVar41._12_4_ = 0x3f800000;
          auVar15 = vpaddd_avx(auVar15,auVar41);
          auVar37 = vpaddd_avx(auVar37,auVar41);
          auVar25._0_4_ =
               (fVar53 + 1.0 +
               fVar53 * fVar53 *
               (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
                 0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5)) * auVar37._0_4_ + 1.0;
          auVar25._4_4_ =
               (fVar55 + 1.0 +
               fVar55 * fVar55 *
               (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                 0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5)) * auVar37._4_4_ + 1.0;
          auVar25._8_4_ =
               (fVar56 + 1.0 +
               fVar56 * fVar56 *
               (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                 0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5)) * auVar37._8_4_ + 1.0;
          auVar25._12_4_ =
               (fVar57 + 1.0 +
               fVar57 * fVar57 *
               (((((fVar57 * 0.00019875691 + 0.0013981999) * fVar57 + 0.008333452) * fVar57 +
                 0.041665796) * fVar57 + 0.16666666) * fVar57 + 0.5)) * auVar37._12_4_ + 1.0;
          auVar25._16_4_ =
               (fVar26 + 1.0 +
               fVar26 * fVar26 *
               (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
                 0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar15._0_4_ + 1.0;
          auVar25._20_4_ =
               (fVar27 + 1.0 +
               fVar27 * fVar27 *
               (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                 0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar15._4_4_ + 1.0;
          auVar25._24_4_ =
               (fVar28 + 1.0 +
               fVar28 * fVar28 *
               (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
                 0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar15._8_4_ + 1.0;
          auVar25._28_4_ = auVar52._28_4_ + auVar22._28_4_ + 1.0 + auVar22._28_4_ + 1.0;
          auVar46 = vrcpps_avx(auVar25);
          fVar53 = auVar46._0_4_;
          fVar55 = auVar46._4_4_;
          fVar56 = auVar46._8_4_;
          fVar57 = auVar46._12_4_;
          fVar26 = auVar46._16_4_;
          fVar27 = auVar46._20_4_;
          fVar28 = auVar46._24_4_;
          auVar2._4_4_ = auVar25._4_4_ * (fVar55 + fVar55);
          auVar2._0_4_ = auVar25._0_4_ * (fVar53 + fVar53);
          auVar2._8_4_ = auVar25._8_4_ * (fVar56 + fVar56);
          auVar2._12_4_ = auVar25._12_4_ * (fVar57 + fVar57);
          auVar2._16_4_ = auVar25._16_4_ * (fVar26 + fVar26);
          auVar2._20_4_ = auVar25._20_4_ * (fVar27 + fVar27);
          auVar2._24_4_ = auVar25._24_4_ * (fVar28 + fVar28);
          auVar2._28_4_ = auVar25._28_4_;
          auVar42._8_4_ = 0x40000000;
          auVar42._0_8_ = 0x4000000040000000;
          auVar42._12_4_ = 0x40000000;
          auVar42._16_4_ = 0x40000000;
          auVar42._20_4_ = 0x40000000;
          auVar42._24_4_ = 0x40000000;
          auVar42._28_4_ = 0x40000000;
          auVar52 = vsubps_avx(auVar42,auVar2);
          *pfVar11 = fVar53 + fVar53 + -1.0 + fVar53 * auVar52._0_4_;
          pfVar11[1] = fVar55 + fVar55 + -1.0 + fVar55 * auVar52._4_4_;
          pfVar11[2] = fVar56 + fVar56 + -1.0 + fVar56 * auVar52._8_4_;
          pfVar11[3] = fVar57 + fVar57 + -1.0 + fVar57 * auVar52._12_4_;
          pfVar11[4] = fVar26 + fVar26 + -1.0 + fVar26 * auVar52._16_4_;
          pfVar11[5] = fVar27 + fVar27 + -1.0 + fVar27 * auVar52._20_4_;
          pfVar11[6] = fVar28 + fVar28 + -1.0 + fVar28 * auVar52._24_4_;
          pfVar11[7] = auVar46._28_4_ + auVar46._28_4_ + -1.0 + auVar52._28_4_;
          pfVar11 = pfVar11 + 8;
          iVar4 = iVar4 + 8;
          uVar8 = uVar9 & 0xfffffff8;
        } while (iVar4 < (int)uVar9);
      }
      auVar44._8_4_ = 0x3f800000;
      auVar44._0_8_ = 0x3f8000003f800000;
      auVar44._12_4_ = 0x3f800000;
      auVar49._8_4_ = 0xc2b0c0a5;
      auVar49._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar49._12_4_ = 0xc2b0c0a5;
      auVar45._8_4_ = 0x40000000;
      auVar45._0_8_ = 0x4000000040000000;
      auVar45._12_4_ = 0x40000000;
      uVar6 = uVar8 | 3;
      while ((int)uVar6 < (int)uVar9) {
        auVar19._0_4_ = *pfVar11 * -2.0;
        auVar19._4_4_ = pfVar11[1] * -2.0;
        auVar19._8_4_ = pfVar11[2] * -2.0;
        auVar19._12_4_ = pfVar11[3] * -2.0;
        auVar29._8_4_ = 0x42b0c0a5;
        auVar29._0_8_ = 0x42b0c0a542b0c0a5;
        auVar29._12_4_ = 0x42b0c0a5;
        auVar15 = vminps_avx(auVar19,auVar29);
        auVar36 = vmaxps_avx(auVar15,auVar49);
        auVar30._0_4_ = auVar36._0_4_ * 1.442695 + 0.5;
        auVar30._4_4_ = auVar36._4_4_ * 1.442695 + 0.5;
        auVar30._8_4_ = auVar36._8_4_ * 1.442695 + 0.5;
        auVar30._12_4_ = auVar36._12_4_ * 1.442695 + 0.5;
        auVar38._0_4_ = (int)auVar30._0_4_;
        auVar38._4_4_ = (int)auVar30._4_4_;
        auVar38._8_4_ = (int)auVar30._8_4_;
        auVar38._12_4_ = (int)auVar30._12_4_;
        auVar37 = vcvtdq2ps_avx(auVar38);
        auVar15 = vcmpps_avx(auVar30,auVar37,1);
        auVar15 = vandps_avx(auVar15,auVar44);
        auVar15 = vsubps_avx(auVar37,auVar15);
        fVar53 = auVar36._0_4_ + auVar15._0_4_ * -0.6931472;
        fVar55 = auVar36._4_4_ + auVar15._4_4_ * -0.6931472;
        fVar56 = auVar36._8_4_ + auVar15._8_4_ * -0.6931472;
        fVar57 = auVar36._12_4_ + auVar15._12_4_ * -0.6931472;
        auVar31._0_4_ = (int)auVar15._0_4_;
        auVar31._4_4_ = (int)auVar15._4_4_;
        auVar31._8_4_ = (int)auVar15._8_4_;
        auVar31._12_4_ = (int)auVar15._12_4_;
        auVar15 = vpslld_avx(auVar31,0x17);
        auVar15 = vpaddd_avx(auVar15,auVar44);
        auVar20._0_4_ =
             (fVar53 + 1.0 +
             fVar53 * fVar53 *
             (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53 +
               0.041665796) * fVar53 + 0.16666666) * fVar53 + 0.5)) * auVar15._0_4_ + 1.0;
        auVar20._4_4_ =
             (fVar55 + 1.0 +
             fVar55 * fVar55 *
             (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
               0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5)) * auVar15._4_4_ + 1.0;
        auVar20._8_4_ =
             (fVar56 + 1.0 +
             fVar56 * fVar56 *
             (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
               0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5)) * auVar15._8_4_ + 1.0;
        auVar20._12_4_ =
             (fVar57 + 1.0 +
             fVar57 * fVar57 *
             (((((fVar57 * 0.00019875691 + 0.0013981999) * fVar57 + 0.008333452) * fVar57 +
               0.041665796) * fVar57 + 0.16666666) * fVar57 + 0.5)) * auVar15._12_4_ + 1.0;
        auVar15 = vrcpps_avx(auVar20);
        fVar53 = auVar15._0_4_;
        fVar55 = auVar15._4_4_;
        fVar56 = auVar15._8_4_;
        fVar57 = auVar15._12_4_;
        auVar21._0_4_ = auVar20._0_4_ * (fVar53 + fVar53);
        auVar21._4_4_ = auVar20._4_4_ * (fVar55 + fVar55);
        auVar21._8_4_ = auVar20._8_4_ * (fVar56 + fVar56);
        auVar21._12_4_ = auVar20._12_4_ * (fVar57 + fVar57);
        auVar15 = vsubps_avx(auVar45,auVar21);
        *pfVar11 = fVar53 + fVar53 + -1.0 + fVar53 * auVar15._0_4_;
        pfVar11[1] = fVar55 + fVar55 + -1.0 + fVar55 * auVar15._4_4_;
        pfVar11[2] = fVar56 + fVar56 + -1.0 + fVar56 * auVar15._8_4_;
        pfVar11[3] = fVar57 + fVar57 + -1.0 + fVar57 * auVar15._12_4_;
        pfVar11 = pfVar11 + 4;
        uVar6 = uVar8 + 7;
        uVar8 = uVar8 + 4;
      }
      if (uVar9 - uVar8 != 0 && (int)uVar8 <= (int)uVar9) {
        lVar12 = 0;
        do {
          fVar53 = tanhf(pfVar11[lVar12]);
          pfVar11[lVar12] = fVar53;
          lVar12 = lVar12 + 1;
        } while (uVar9 - uVar8 != (int)lVar12);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar10);
  }
  return 0;
}

Assistant:

int TanH_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = tanh_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = tanh_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}